

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  uint32_t member_idx;
  iterator iVar1;
  bool bVar2;
  initializer_list<unsigned_int> init_list;
  uint32_t type_id;
  uint32_t local_44;
  SmallVector<unsigned_int,_2UL> local_40;
  
  if ((inst->opcode_ != OpMemberName) && (inst->opcode_ != OpMemberDecorate)) {
    __assert_fail("inst->opcode() == spv::Op::OpMemberName || inst->opcode() == spv::Op::OpMemberDecorate"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0x16e,
                  "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate(Instruction *)"
                 );
  }
  bVar2 = false;
  type_id = Instruction::GetSingleWordInOperand(inst,0);
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->used_members_)._M_h,&type_id);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    member_idx = Instruction::GetSingleWordInOperand(inst,1);
    local_44 = GetNewMemberIndex(this,type_id,member_idx);
    if (local_44 == 0xffffffff) {
      IRContext::KillInst((this->super_MemPass).super_Pass.context_,inst);
    }
    else {
      if (local_44 == member_idx) {
        return false;
      }
      init_list._M_len = 1;
      init_list._M_array = &local_44;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_40,init_list);
      Instruction::SetInOperand(inst,1,&local_40);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_40);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpMemberName ||
         inst->opcode() == spv::Op::OpMemberDecorate);

  uint32_t type_id = inst->GetSingleWordInOperand(0);
  auto live_members = used_members_.find(type_id);
  if (live_members == used_members_.end()) {
    return false;
  }

  uint32_t orig_member_idx = inst->GetSingleWordInOperand(1);
  uint32_t new_member_idx = GetNewMemberIndex(type_id, orig_member_idx);

  if (new_member_idx == kRemovedMember) {
    context()->KillInst(inst);
    return true;
  }

  if (new_member_idx == orig_member_idx) {
    return false;
  }

  inst->SetInOperand(1, {new_member_idx});
  return true;
}